

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O2

void __thiscall QPDFJob::writeQPDF(QPDFJob *this,QPDF *pdf)

{
  pointer pQVar1;
  bool bVar2;
  element_type *peVar3;
  Pipeline *pPVar4;
  size_t i;
  vector<QPDFExc,_std::allocator<QPDFExc>_> local_40;
  
  peVar3 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (((peVar3->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
       (element_type *)0x0) || (peVar3->replace_input == true)) {
    QPDF::getLogger((QPDF *)&local_40);
    bVar2 = Pl_Flate::zopfli_check_env
                      ((QPDFLogger *)
                       local_40.super__Vector_base<QPDFExc,_std::allocator<QPDFExc>_>._M_impl.
                       super__Vector_impl_data._M_start);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_40.super__Vector_base<QPDFExc,_std::allocator<QPDFExc>_>._M_impl.
                super__Vector_impl_data._M_finish);
    peVar3 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (!bVar2) {
      peVar3->warnings = true;
    }
  }
  if (((peVar3->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
       (element_type *)0x0) && (peVar3->replace_input == false)) {
    doInspection(this,pdf);
  }
  else if (peVar3->split_pages == 0) {
    writeOutfile(this,pdf);
  }
  else {
    doSplitPages(this,pdf);
  }
  QPDF::getWarnings(&local_40,pdf);
  pQVar1 = local_40.super__Vector_base<QPDFExc,_std::allocator<QPDFExc>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::vector<QPDFExc,_std::allocator<QPDFExc>_>::~vector(&local_40);
  peVar3 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (pQVar1 == local_40.super__Vector_base<QPDFExc,_std::allocator<QPDFExc>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    if ((peVar3->warnings & 1U) == 0) goto LAB_00160e27;
  }
  else {
    peVar3->warnings = true;
  }
  if (peVar3->suppress_warnings == false) {
    if (((peVar3->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
         (element_type *)0x0) && (peVar3->replace_input != true)) {
      QPDFLogger::getWarn((QPDFLogger *)&local_40,
                          SUB81((peVar3->log).
                                super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0)
                         );
      pPVar4 = Pipeline::operator<<
                         ((Pipeline *)
                          local_40.super__Vector_base<QPDFExc,_std::allocator<QPDFExc>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          &((this->m).
                            super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                           ->message_prefix);
      Pipeline::operator<<(pPVar4,": operation succeeded with warnings\n");
    }
    else {
      QPDFLogger::getWarn((QPDFLogger *)&local_40,
                          SUB81((peVar3->log).
                                super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0)
                         );
      pPVar4 = Pipeline::operator<<
                         ((Pipeline *)
                          local_40.super__Vector_base<QPDFExc,_std::allocator<QPDFExc>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          &((this->m).
                            super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                           ->message_prefix);
      Pipeline::operator<<
                (pPVar4,
                 ": operation succeeded with warnings; resulting file may have some problems\n");
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_40.super__Vector_base<QPDFExc,_std::allocator<QPDFExc>_>._M_impl.
                super__Vector_impl_data._M_finish);
  }
LAB_00160e27:
  if (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      report_mem_usage == true) {
    i = QUtil::get_max_memory_usage();
    QPDFLogger::getWarn((QPDFLogger *)&local_40,
                        SUB81((((this->m).
                                super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->log).
                              super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0));
    pPVar4 = Pipeline::operator<<
                       ((Pipeline *)
                        local_40.super__Vector_base<QPDFExc,_std::allocator<QPDFExc>_>._M_impl.
                        super__Vector_impl_data._M_start,"qpdf-max-memory-usage ");
    pPVar4 = Pipeline::operator<<(pPVar4,i);
    Pipeline::operator<<(pPVar4,"\n");
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_40.super__Vector_base<QPDFExc,_std::allocator<QPDFExc>_>._M_impl.
                super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void
QPDFJob::writeQPDF(QPDF& pdf)
{
    if (createsOutput()) {
        if (!Pl_Flate::zopfli_check_env(pdf.getLogger().get())) {
            m->warnings = true;
        }
    }
    if (!createsOutput()) {
        doInspection(pdf);
    } else if (m->split_pages) {
        doSplitPages(pdf);
    } else {
        writeOutfile(pdf);
    }
    if (!pdf.getWarnings().empty()) {
        m->warnings = true;
    }
    if (m->warnings && (!m->suppress_warnings)) {
        if (createsOutput()) {
            *m->log->getWarn()
                << m->message_prefix
                << ": operation succeeded with warnings; resulting file may have some problems\n";
        } else {
            *m->log->getWarn() << m->message_prefix << ": operation succeeded with warnings\n";
        }
    }
    if (m->report_mem_usage) {
        // Call get_max_memory_usage before generating output. When debugging, it's easier if print
        // statements from get_max_memory_usage are not interleaved with the output.
        auto mem_usage = QUtil::get_max_memory_usage();
        *m->log->getWarn() << "qpdf-max-memory-usage " << mem_usage << "\n";
    }
}